

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O0

bool MeCab::anon_unknown_20::is_valid_node<mecab_node_t>(Lattice *lattice,mecab_node_t *node)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_RSI;
  long *in_RDI;
  char *feature;
  size_t begin_pos;
  size_t end_pos;
  char *in_stack_000000e0;
  char *in_stack_000000e8;
  bool local_1;
  
  lVar4 = *(long *)(in_RSI + 0x30);
  lVar3 = (**(code **)(*in_RDI + 0x40))();
  lVar4 = (lVar4 - lVar3) + (ulong)*(ushort *)(in_RSI + 0x44);
  iVar2 = (**(code **)(*in_RDI + 0xf8))(in_RDI,lVar4);
  if (iVar2 == 2) {
    local_1 = false;
  }
  else {
    lVar3 = *(long *)(in_RSI + 0x30);
    lVar5 = (**(code **)(*in_RDI + 0x40))();
    lVar3 = ((lVar3 - lVar5) + (ulong)*(ushort *)(in_RSI + 0x44)) -
            (ulong)*(ushort *)(in_RSI + 0x46);
    lVar5 = (**(code **)(*in_RDI + 0x100))(in_RDI,lVar3);
    if (lVar5 == 0) {
      local_1 = true;
    }
    else {
      iVar2 = (**(code **)(*in_RDI + 0xf8))(in_RDI,lVar3);
      if (((iVar2 == 1) && (iVar2 = (**(code **)(*in_RDI + 0xf8))(in_RDI,lVar4), iVar2 == 1)) &&
         (bVar1 = partial_match(in_stack_000000e8,in_stack_000000e0), bVar1)) {
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool is_valid_node(const Lattice *lattice,  N *node) {
  const size_t end_pos = node->surface - lattice->sentence() + node->length;
  if (lattice->boundary_constraint(end_pos) == MECAB_INSIDE_TOKEN) {
    return false;
  }
  const size_t begin_pos =
      node->surface - lattice->sentence() + node->length - node->rlength;
  const char *feature = lattice->feature_constraint(begin_pos);
  if (!feature) {
    return true;
  }
  if (lattice->boundary_constraint(begin_pos) == MECAB_TOKEN_BOUNDARY &&
      lattice->boundary_constraint(end_pos) == MECAB_TOKEN_BOUNDARY &&
      partial_match(feature, node->feature)) {
    return true;
  }
  return false;
}